

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

void __thiscall Rml::HandleEdgeMarginParser::HandleEdgeMarginParser(HandleEdgeMarginParser *this)

{
  PropertyId PVar1;
  PropertyId PVar2;
  PropertyId PVar3;
  PropertyId PVar4;
  ShorthandId SVar5;
  PropertyDefinition *pPVar6;
  allocator<char> aStack_238;
  allocator<char> local_237;
  allocator<char> local_236;
  allocator<char> local_235;
  allocator<char> local_234;
  allocator<char> local_233;
  allocator<char> local_232;
  allocator<char> local_231;
  allocator<char> local_230;
  allocator<char> local_22f;
  allocator<char> local_22e;
  allocator<char> local_22d;
  allocator<char> local_22c;
  allocator<char> local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  String local_228;
  String local_208;
  String local_1e8;
  String local_1c8;
  String local_1a8;
  String local_188;
  String local_168;
  String local_148;
  String local_128;
  String local_108;
  String local_e8;
  String local_c8;
  String local_a8;
  String local_88;
  String local_68;
  String local_48;
  
  PropertySpecification::PropertySpecification(&this->specification,4,1);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"edge-t",&local_229);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_22a);
  pPVar6 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_208,&local_228,false,false,Invalid);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"length_percent",&local_22b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_22c);
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_1c8,&local_1e8);
  PVar1 = PropertyDefinition::GetId(pPVar6);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"edge-r",&local_22d);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_22e);
  pPVar6 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_48,&local_68,false,false,Invalid);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"length_percent",&local_22f);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_230);
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_88,&local_a8);
  PVar2 = PropertyDefinition::GetId(pPVar6);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"edge-b",&local_231);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_232);
  pPVar6 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_c8,&local_e8,false,false,Invalid);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"length_percent",&local_233);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_234);
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_108,&local_128);
  PVar3 = PropertyDefinition::GetId(pPVar6);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"edge-l",&local_235);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_236);
  pPVar6 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_148,&local_168,false,false,Invalid);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"length_percent",&local_237);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&aStack_238);
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_188,&local_1a8);
  PVar4 = PropertyDefinition::GetId(pPVar6);
  (this->ids)._M_elems[0] = PVar1;
  (this->ids)._M_elems[1] = PVar2;
  (this->ids)._M_elems[2] = PVar3;
  (this->ids)._M_elems[3] = PVar4;
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_188);
  ::std::__cxx11::string::~string((string *)&local_168);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"edge-margin",(allocator<char> *)&local_1c8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"edge-t, edge-r, edge-b, edge-l",(allocator<char> *)&local_1e8);
  SVar5 = PropertySpecification::RegisterShorthand
                    (&this->specification,&local_208,&local_228,Box,Invalid);
  this->id_constraint = SVar5;
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_208);
  return;
}

Assistant:

HandleEdgeMarginParser() : specification(4, 1)
	{
		ids = {
			specification.RegisterProperty("edge-t", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-r", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-b", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-l", "", false, false).AddParser("length_percent").GetId(),
		};
		id_constraint = specification.RegisterShorthand("edge-margin", "edge-t, edge-r, edge-b, edge-l", ShorthandType::Box);
	}